

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering.hpp
# Opt level: O0

Option<Kernel::TermList> __thiscall
Kernel::LAKBO::skeleton(LAKBO *this,Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison> *t)

{
  anon_class_8_1_54a39814 in_RDX;
  MaybeUninit<Kernel::TermList> extraout_RDX;
  FuncTerm *in_RSI;
  undefined8 in_RDI;
  Option<Kernel::TermList> OVar1;
  undefined1 in_stack_00000070 [16];
  Option<Lib::Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
  *in_stack_ffffffffffffffe0;
  
  Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>::operator->(in_RDX.t);
  FuncTerm::iterArgs(in_RSI);
  trySkeleton<Lib::IterTraits<Lib::Stack<Kernel::PolyNf>::BottomFirstIterator>>
            (this,(IterTraits<Lib::Stack<Kernel::PolyNf>::BottomFirstIterator>)in_stack_00000070);
  Lib::
  Option<Lib::Recycled<Lib::Stack<Kernel::TermList>,Lib::DefaultReset,Lib::DefaultKeepRecycled>>::
  map<Kernel::LAKBO::skeleton(Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>const&)const::_lambda(auto:1)_1_>
            (in_stack_ffffffffffffffe0,in_RDX);
  Lib::
  Option<Lib::Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
  ::~Option((Option<Lib::Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
             *)0x8cfe8d);
  OVar1.super_OptionBase<Kernel::TermList>._elem._elem = extraout_RDX._elem;
  OVar1.super_OptionBase<Kernel::TermList>._0_8_ = in_RDI;
  return (Option<Kernel::TermList>)OVar1.super_OptionBase<Kernel::TermList>;
}

Assistant:

Option<TermList> skeleton(Perfect<FuncTerm> const& t) const {
    return trySkeleton(t->iterArgs())
      .map([&](auto args) {
          if (t->function().isFloor()) {
            return args[0];
          } else {
            return TermList(Term::createFromIter(
                  t->function().id(),
                  concatIters(
                    t->function().iterTypeArgs(),
                    arrayIter(*args)
                    )));
          }
      });
  }